

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::
getTECode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,
          _tessellation_primitive_mode primitive_mode)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  size_t token_index;
  string local_78 [8];
  string token;
  allocator<char> local_42;
  byte local_41;
  undefined1 local_40 [8];
  string primitive_mode_string;
  _tessellation_primitive_mode primitive_mode_local;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this_local;
  string *result;
  
  primitive_mode_string.field_2._12_4_ = primitive_mode;
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            ((string *)local_40,(TessellationShaderUtils *)(ulong)primitive_mode,primitive_mode);
  pcVar2 = getTECode::te_body;
  local_41 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2,&local_42);
  std::allocator<char>::~allocator(&local_42);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"PRIMITIVE_MODE",(allocator<char> *)((long)&token_index + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&token_index + 7));
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_78);
    if (uVar1 == 0xffffffffffffffff) break;
    pcVar2 = (char *)std::__cxx11::string::length();
    std::__cxx11::string::c_str();
    psVar3 = (string *)std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,pcVar2);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,psVar3);
    std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_78);
  }
  local_41 = 1;
  std::__cxx11::string::~string(local_78);
  if ((local_41 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::getTECode(
	_tessellation_primitive_mode primitive_mode)
{
	static const char* te_body = "${VERSION}\n"
								 "\n"
								 "${TESSELLATION_SHADER_REQUIRE}\n"
								 "\n"
								 "layout(PRIMITIVE_MODE) in;\n"
								 "\n"
								 "in TC_OUT\n"
								 "{\n"
								 "    int tc_invocation_id;\n"
								 "    int tc_patch_vertices_in;\n"
								 "    int tc_primitive_id;\n"
								 "} in_tc[];\n"
								 "\n"
								 "out int te_tc_invocation_id;\n"
								 "out int te_tc_patch_vertices_in;\n"
								 "out int te_tc_primitive_id;\n"
								 "out int te_patch_vertices_in;\n"
								 "out int te_primitive_id;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    te_tc_invocation_id     = in_tc[gl_PatchVerticesIn-1].tc_invocation_id;\n"
								 "    te_tc_patch_vertices_in = in_tc[gl_PatchVerticesIn-1].tc_patch_vertices_in;\n"
								 "    te_tc_primitive_id      = in_tc[gl_PatchVerticesIn-1].tc_primitive_id;\n"
								 "    te_patch_vertices_in    = gl_PatchVerticesIn;\n"
								 "    te_primitive_id         = gl_PrimitiveID;\n"
								 "}";

	/* Replace PRIMITIVE_MODE with user-provided value */
	std::string		  primitive_mode_string = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	std::string		  result				= te_body;
	const std::string token					= "PRIMITIVE_MODE";
	std::size_t		  token_index			= std::string::npos;

	while ((token_index = result.find(token)) != std::string::npos)
	{
		result = result.replace(token_index, token.length(), primitive_mode_string.c_str());

		token_index = result.find(token);
	}

	return result;
}